

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int sensi_meth;
  int err_con;
  int sensi;
  N_Vector *yS;
  int is;
  sunrealtype pbar [3];
  char fname [256];
  FILE *FID;
  UserData data;
  int iout;
  int retval;
  void *cvode_mem;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector y;
  sunrealtype tout;
  sunrealtype t;
  SUNContext sunctx;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  void *returnvalue;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  sunrealtype in_stack_fffffffffffffe78;
  void *in_stack_fffffffffffffe80;
  char local_168 [264];
  FILE *local_60;
  sunrealtype *local_58;
  int local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  long *local_30;
  double local_28;
  undefined1 local_20 [8];
  undefined8 local_18 [2];
  int local_4;
  
  local_4 = 0;
  local_58 = (sunrealtype *)0x0;
  local_30 = (long *)0x0;
  returnvalue = (void *)0x0;
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  ProcessArgs(in_stack_fffffffffffffe74,(char **)0x0,
              (int *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
              (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),(int *)0x102429);
  local_58 = (sunrealtype *)malloc(0x18);
  iVar1 = check_retval(returnvalue,
                       (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe5c);
  if (iVar1 == 0) {
    *local_58 = 0.04;
    local_58[1] = 10000.0;
    local_58[2] = 30000000.0;
    local_4c = SUNContext_Create(0,local_18);
    iVar1 = check_retval(returnvalue,
                         (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe5c);
    if (iVar1 == 0) {
      local_30 = (long *)N_VNew_Serial(3,local_18[0]);
      iVar1 = check_retval(returnvalue,
                           (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           in_stack_fffffffffffffe5c);
      if (iVar1 == 0) {
        **(undefined8 **)(*local_30 + 0x10) = 0x3ff0000000000000;
        *(undefined8 *)(*(long *)(*local_30 + 0x10) + 8) = 0;
        *(undefined8 *)(*(long *)(*local_30 + 0x10) + 0x10) = 0;
        local_48 = CVodeCreate(2,local_18[0]);
        iVar1 = check_retval(returnvalue,
                             (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             in_stack_fffffffffffffe5c);
        if (iVar1 == 0) {
          local_4c = CVodeInit(0,local_48,f,local_30);
          iVar1 = check_retval(returnvalue,
                               (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                               ,in_stack_fffffffffffffe5c);
          if (iVar1 == 0) {
            local_4c = CVodeWFtolerances(local_48,ewt);
            iVar1 = check_retval(returnvalue,
                                 (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                  in_stack_fffffffffffffe60),
                                 in_stack_fffffffffffffe5c);
            if (iVar1 == 0) {
              local_4c = CVodeSetUserData(local_48,local_58);
              iVar1 = check_retval(returnvalue,
                                   (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                    in_stack_fffffffffffffe60),
                                   in_stack_fffffffffffffe5c);
              if (iVar1 == 0) {
                local_38 = SUNDenseMatrix(3,3,local_18[0]);
                iVar1 = check_retval(returnvalue,
                                     (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                      in_stack_fffffffffffffe60),
                                     in_stack_fffffffffffffe5c);
                if (iVar1 == 0) {
                  local_40 = SUNLinSol_Dense(local_30,local_38,local_18[0]);
                  iVar1 = check_retval(returnvalue,
                                       (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                        in_stack_fffffffffffffe60),
                                       in_stack_fffffffffffffe5c);
                  if (iVar1 == 0) {
                    local_4c = CVodeSetLinearSolver(local_48,local_40,local_38);
                    iVar1 = check_retval(returnvalue,
                                         (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                          in_stack_fffffffffffffe60),
                                         in_stack_fffffffffffffe5c);
                    if (iVar1 == 0) {
                      local_4c = CVodeSetJacFn(local_48,Jac);
                      iVar1 = check_retval(returnvalue,
                                           (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                            in_stack_fffffffffffffe60),
                                           in_stack_fffffffffffffe5c);
                      if (iVar1 == 0) {
                        printf(" \n3-species kinetics problem\n");
                        if (in_stack_fffffffffffffe64 == 0) {
                          printf("Sensitivity: NO ");
                        }
                        else {
                          in_stack_fffffffffffffe78 = *local_58;
                          in_stack_fffffffffffffe80 = (void *)local_58[1];
                          returnvalue = (void *)N_VCloneVectorArray(3,local_30);
                          iVar1 = check_retval(returnvalue,
                                               (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                                in_stack_fffffffffffffe60),
                                               in_stack_fffffffffffffe5c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          for (in_stack_fffffffffffffe74 = 0; in_stack_fffffffffffffe74 < 3;
                              in_stack_fffffffffffffe74 = in_stack_fffffffffffffe74 + 1) {
                            N_VConst(0,*(undefined8 *)
                                        ((long)returnvalue + (long)in_stack_fffffffffffffe74 * 8));
                          }
                          local_4c = CVodeSensInit1(local_48,3,in_stack_fffffffffffffe5c,fS,
                                                    returnvalue);
                          iVar1 = check_retval(returnvalue,
                                               (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                                in_stack_fffffffffffffe60),
                                               in_stack_fffffffffffffe5c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          local_4c = CVodeSensEEtolerances(local_48);
                          iVar1 = check_retval(returnvalue,
                                               (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                                in_stack_fffffffffffffe60),
                                               in_stack_fffffffffffffe5c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          local_4c = CVodeSetSensErrCon(local_48,in_stack_fffffffffffffe60);
                          iVar1 = check_retval(returnvalue,
                                               (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                                in_stack_fffffffffffffe60),
                                               in_stack_fffffffffffffe5c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          local_4c = CVodeSetSensParams(local_48,0,&stack0xfffffffffffffe78);
                          iVar1 = check_retval(returnvalue,
                                               (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                                in_stack_fffffffffffffe60),
                                               in_stack_fffffffffffffe5c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          printf("Sensitivity: YES ");
                          if (in_stack_fffffffffffffe5c == 1) {
                            printf("( SIMULTANEOUS +");
                          }
                          else if (in_stack_fffffffffffffe5c == 2) {
                            printf("( STAGGERED +");
                          }
                          else {
                            printf("( STAGGERED1 +");
                          }
                          if (in_stack_fffffffffffffe60 == 0) {
                            printf(" PARTIAL ERROR CONTROL )");
                          }
                          else {
                            printf(" FULL ERROR CONTROL )");
                          }
                        }
                        printf("\n\n");
                        printf("===========================================");
                        printf("============================\n");
                        printf("     T     Q       H      NST           y1");
                        printf("           y2           y3    \n");
                        printf("===========================================");
                        printf("============================\n");
                        local_28 = 0.4;
                        for (local_50 = 1; local_50 < 0xd; local_50 = local_50 + 1) {
                          local_4c = CVode(local_28,local_48,local_30,local_20,1);
                          iVar1 = check_retval(returnvalue,
                                               (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                                in_stack_fffffffffffffe60),
                                               in_stack_fffffffffffffe5c);
                          if (iVar1 != 0) break;
                          PrintOutput(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                                      (N_Vector)
                                      CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))
                          ;
                          if (in_stack_fffffffffffffe64 != 0) {
                            local_4c = CVodeGetSens(local_48,local_20,returnvalue);
                            iVar1 = check_retval(returnvalue,
                                                 (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                                  in_stack_fffffffffffffe60),
                                                 in_stack_fffffffffffffe5c);
                            if (iVar1 != 0) break;
                            PrintOutputS((N_Vector *)
                                         CONCAT44(in_stack_fffffffffffffe64,
                                                  in_stack_fffffffffffffe60));
                          }
                          printf("-----------------------------------------");
                          printf("------------------------------\n");
                          local_28 = local_28 * 10.0;
                        }
                        printf("\nFinal Statistics:\n");
                        local_4c = CVodePrintAllStats(local_48,_stdout,0);
                        strcpy(local_168,"cvsRoberts_FSA_dns_stats");
                        if (in_stack_fffffffffffffe64 != 0) {
                          if (in_stack_fffffffffffffe5c == 1) {
                            strcat(local_168,"_-sensi_sim");
                          }
                          else if (in_stack_fffffffffffffe5c == 2) {
                            strcat(local_168,"_-sensi_stg");
                          }
                          else {
                            strcat(local_168,"_-sensi_stg1");
                          }
                          if (in_stack_fffffffffffffe60 == 0) {
                            strcat(local_168,"_f");
                          }
                          else {
                            strcat(local_168,"_t");
                          }
                        }
                        strcat(local_168,".csv");
                        local_60 = fopen(local_168,"w");
                        local_4c = CVodePrintAllStats(local_48,local_60,1);
                        fclose(local_60);
                        N_VDestroy(local_30);
                        if (in_stack_fffffffffffffe64 != 0) {
                          N_VDestroyVectorArray(returnvalue,3);
                        }
                        free(local_58);
                        CVodeFree(&local_48);
                        SUNLinSolFree(local_40);
                        SUNMatDestroy(local_38);
                        SUNContext_Free(local_18);
                        local_4 = 0;
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  sunrealtype t, tout;
  N_Vector y;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout;
  UserData data;
  FILE* FID;
  char fname[256];

  sunrealtype pbar[NS];
  int is;
  N_Vector* yS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  data      = NULL;
  y         = NULL;
  yS        = NULL;
  A         = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  /* Initialize sensitivity variables (reaction rates for this problem) */
  data->p[0] = SUN_RCONST(0.04);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize y */
  Ith(y, 1) = Y1;
  Ith(y, 2) = Y2;
  Ith(y, 3) = Y3;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeWFtolerances to specify a user-supplied function ewt that sets
   * the multiplicative error weights w_i for use in the weighted RMS norm */
  retval = CVodeWFtolerances(cvode_mem, ewt);
  if (check_retval(&retval, "CVodeWFtolerances", 1)) { return (1); }

  /* Attach user data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  printf(" \n3-species kinetics problem\n");

  /* Sensitivity-related settings */
  if (sensi)
  {
    /* Set parameter scaling factor */
    pbar[0] = data->p[0];
    pbar[1] = data->p[1];
    pbar[2] = data->p[2];

    /* Set sensitivity initial conditions */
    yS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)yS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yS[is]); }

    /* Call CVodeSensInit1 to activate forward sensitivity computations
     * and allocate internal memory for COVEDS related to sensitivity
     * calculations. Computes the right-hand sides of the sensitivity
     * ODE, one at a time */
    retval = CVodeSensInit1(cvode_mem, NS, sensi_meth, fS, yS);
    if (check_retval(&retval, "CVodeSensInit", 1)) { return (1); }

    /* Call CVodeSensEEtolerances to estimate tolerances for sensitivity
     * variables based on the rolerances supplied for states variables and
     * the scaling factor pbar */
    retval = CVodeSensEEtolerances(cvode_mem);
    if (check_retval(&retval, "CVodeSensEEtolerances", 1)) { return (1); }

    /* Set sensitivity analysis optional inputs */
    /* Call CVodeSetSensErrCon to specify the error control strategy for
     * sensitivity variables */
    retval = CVodeSetSensErrCon(cvode_mem, err_con);
    if (check_retval(&retval, "CVodeSetSensErrCon", 1)) { return (1); }

    /* Call CVodeSetSensParams to specify problem parameter information for
     * sensitivity calculations */
    retval = CVodeSetSensParams(cvode_mem, NULL, pbar, NULL);
    if (check_retval(&retval, "CVodeSetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == CV_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else if (sensi_meth == CV_STAGGERED) { printf("( STAGGERED +"); }
    else { printf("( STAGGERED1 +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /* In loop, call CVode, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached.  */

  printf("\n\n");
  printf("===========================================");
  printf("============================\n");
  printf("     T     Q       H      NST           y1");
  printf("           y2           y3    \n");
  printf("===========================================");
  printf("============================\n");

  for (iout = 1, tout = T1; iout <= NOUT; iout++, tout *= TMULT)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }

    PrintOutput(cvode_mem, t, y);

    /* Call CVodeGetSens to get the sensitivity solution vector after a
     * successful return from CVode */
    if (sensi)
    {
      retval = CVodeGetSens(cvode_mem, &t, yS);
      if (check_retval(&retval, "CVodeGetSens", 1)) { break; }
      PrintOutputS(yS);
    }
    printf("-----------------------------------------");
    printf("------------------------------\n");
  }

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(cvode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  strcpy(fname, "cvsRoberts_FSA_dns_stats");
  if (sensi)
  {
    if (sensi_meth == CV_SIMULTANEOUS) { strcat(fname, "_-sensi_sim"); }
    else if (sensi_meth == CV_STAGGERED) { strcat(fname, "_-sensi_stg"); }
    else { strcat(fname, "_-sensi_stg1"); }
    if (err_con) { strcat(fname, "_t"); }
    else { strcat(fname, "_f"); }
  }
  strcat(fname, ".csv");
  FID    = fopen(fname, "w");
  retval = CVodePrintAllStats(cvode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free memory */
  N_VDestroy(y); /* Free y vector */
  if (sensi) { N_VDestroyVectorArray(yS, NS); /* Free yS vector */ }
  free(data);               /* Free user data */
  CVodeFree(&cvode_mem);    /* Free CVODES memory */
  SUNLinSolFree(LS);        /* Free the linear solver memory */
  SUNMatDestroy(A);         /* Free the matrix memory */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS context */

  return (0);
}